

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O1

void Pla_AbcFreeMan(Abc_Frame_t *pAbc)

{
  undefined8 *__ptr;
  long lVar1;
  long lVar2;
  
  __ptr = (undefined8 *)pAbc->pAbcPla;
  if (__ptr != (undefined8 *)0x0) {
    if ((void *)__ptr[6] != (void *)0x0) {
      free((void *)__ptr[6]);
      __ptr[6] = 0;
    }
    __ptr[5] = 0;
    if ((void *)__ptr[8] != (void *)0x0) {
      free((void *)__ptr[8]);
      __ptr[8] = 0;
    }
    __ptr[7] = 0;
    if ((void *)__ptr[10] != (void *)0x0) {
      free((void *)__ptr[10]);
      __ptr[10] = 0;
    }
    __ptr[9] = 0;
    if ((void *)__ptr[0xc] != (void *)0x0) {
      free((void *)__ptr[0xc]);
      __ptr[0xc] = 0;
    }
    __ptr[0xb] = 0;
    if (0 < *(int *)(__ptr + 0xd)) {
      lVar1 = 8;
      lVar2 = 0;
      do {
        if (*(void **)(__ptr[0xe] + lVar1) != (void *)0x0) {
          free(*(void **)(__ptr[0xe] + lVar1));
          *(undefined8 *)(__ptr[0xe] + lVar1) = 0;
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar2 < *(int *)(__ptr + 0xd));
    }
    if ((void *)__ptr[0xe] != (void *)0x0) {
      free((void *)__ptr[0xe]);
      __ptr[0xe] = 0;
    }
    __ptr[0xd] = 0;
    if (0 < *(int *)(__ptr + 0xf)) {
      lVar1 = 8;
      lVar2 = 0;
      do {
        if (*(void **)(__ptr[0x10] + lVar1) != (void *)0x0) {
          free(*(void **)(__ptr[0x10] + lVar1));
          *(undefined8 *)(__ptr[0x10] + lVar1) = 0;
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar2 < *(int *)(__ptr + 0xf));
    }
    if ((void *)__ptr[0x10] != (void *)0x0) {
      free((void *)__ptr[0x10]);
      __ptr[0x10] = 0;
    }
    __ptr[0xf] = 0;
    if ((void *)__ptr[0x12] != (void *)0x0) {
      free((void *)__ptr[0x12]);
      __ptr[0x12] = 0;
    }
    __ptr[0x11] = 0;
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
      *__ptr = 0;
    }
    if ((void *)__ptr[1] != (void *)0x0) {
      free((void *)__ptr[1]);
      __ptr[1] = 0;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static inline void        Pla_AbcFreeMan( Abc_Frame_t * pAbc )                   { if ( pAbc->pAbcPla ) Pla_ManFree(Pla_AbcGetMan(pAbc));  }